

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

void __thiscall csv::internals::MmapParser::next(MmapParser *this,size_t bytes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *token;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  pointer pvVar6;
  size_type sVar7;
  RawCSVData *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  size_t sVar9;
  int *piVar10;
  void *__tmp;
  error_code *in_R9;
  ulong offset;
  error_code error;
  basic_mmap<(mio::access_mode)0,_char> local_58;
  int local_30;
  int iStack_2c;
  undefined8 uStack_28;
  
  (this->super_IBasicCSVParser).field_start = -1;
  (this->super_IBasicCSVParser).field_length = 0;
  local_58.data_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<csv::internals::RawCSVData,std::allocator<csv::internals::RawCSVData>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.length_,
             (RawCSVData **)&local_58,(allocator<csv::internals::RawCSVData> *)&local_30);
  sVar7 = local_58.length_;
  pvVar6 = local_58.data_;
  local_58.data_ = (pointer)0x0;
  local_58.length_ = 0;
  p_Var1 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->super_IBasicCSVParser).data_ptr.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pvVar6;
  (this->super_IBasicCSVParser).data_ptr.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar7;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.length_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.length_);
  }
  memcpy(&((this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parse_flags,&(this->super_IBasicCSVParser)._parse_flags,0x400);
  peVar2 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->super_IBasicCSVParser)._col_names.
           super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_IBasicCSVParser)._col_names.
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_IBasicCSVParser).fields =
       &((this->super_IBasicCSVParser).data_ptr.
         super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fields;
  token = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->mmap_pos;
  offset = (this->super_IBasicCSVParser).source_size - (long)token;
  if (bytes <= offset) {
    offset = bytes;
  }
  local_30 = 0;
  uStack_28 = std::_V2::system_category();
  mio::make_mmap<mio::basic_mmap<(mio::access_mode)0,char>,std::__cxx11::string>
            (&local_58,(mio *)&this->_filename,token,offset,(int64_t)&local_30,in_R9);
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00112d10;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)local_58.data_;
  p_Var8[1]._M_use_count = (undefined4)local_58.length_;
  p_Var8[1]._M_weak_count = local_58.length_._4_4_;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)local_58.mapped_length_;
  p_Var8[2]._M_use_count = local_58.file_handle_;
  *(bool *)&p_Var8[2]._M_weak_count = local_58.is_handle_internal_;
  local_58.data_ = (pointer)0x0;
  local_58.length_ = 0;
  local_58.mapped_length_ = 0;
  local_58.file_handle_ = -1;
  peVar2 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = p_Var8 + 1;
  p_Var1 = (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  mio::basic_mmap<(mio::access_mode)0,_char>::unmap(&local_58);
  this->mmap_pos = this->mmap_pos + offset;
  if (local_30 == 0) {
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    puVar3 = (undefined8 *)
             (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar4 = (char *)*puVar3;
    (peVar2->data)._M_len = puVar3[1];
    (peVar2->data)._M_str = pcVar4;
    peVar2 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
    }
    (this->super_IBasicCSVParser).current_row.data.
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    p_Var8 = (this->super_IBasicCSVParser).current_row.data.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->super_IBasicCSVParser).current_row.data.
    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    (this->super_IBasicCSVParser).current_row.data_start = 0;
    (this->super_IBasicCSVParser).current_row.fields_start = 0;
    (this->super_IBasicCSVParser).current_row.row_length = 0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    sVar9 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
    uVar5 = (this->super_IBasicCSVParser).source_size;
    if (this->mmap_pos == uVar5 || uVar5 < 10000000) {
      (this->super_IBasicCSVParser)._eof = true;
      IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
    }
    this->mmap_pos = this->mmap_pos + (sVar9 - offset);
    return;
  }
  piVar10 = (int *)__cxa_allocate_exception(0x10);
  *piVar10 = local_30;
  piVar10[1] = iStack_2c;
  piVar10[2] = (int)uStack_28;
  piVar10[3] = uStack_28._4_4_;
  __cxa_throw(piVar10,&std::error_code::typeinfo,0);
}

Assistant:

CSV_INLINE void MmapParser::next(size_t bytes = ITERATION_CHUNK_SIZE) {
            // Reset parser state
            this->field_start = UNINITIALIZED_FIELD;
            this->field_length = 0;
            this->reset_data_ptr();

            // Create memory map
            size_t length = std::min(this->source_size - this->mmap_pos, bytes);
            std::error_code error;
            this->data_ptr->_data = std::make_shared<mio::basic_mmap_source<char>>(mio::make_mmap_source(this->_filename, this->mmap_pos, length, error));
            this->mmap_pos += length;
            if (error) throw error;

            auto mmap_ptr = (mio::basic_mmap_source<char>*)(this->data_ptr->_data.get());

            // Create string view
            this->data_ptr->data = csv::string_view(mmap_ptr->data(), mmap_ptr->length());

            // Parse
            this->current_row = CSVRow(this->data_ptr);
            size_t remainder = this->parse();            

            if (this->mmap_pos == this->source_size || no_chunk()) {
                this->_eof = true;
                this->end_feed();
            }

            this->mmap_pos -= (length - remainder);
        }